

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_reorder.cpp
# Opt level: O2

void Omega_h::reorder_by_globals(Mesh *mesh)

{
  Omega_h *this;
  Int IVar1;
  Write<int> *this_00;
  long lVar2;
  undefined1 auStack_98 [32];
  LOs new_ents2old_ents [4];
  
  this_00 = &new_ents2old_ents[0].write_;
  new_ents2old_ents[3].write_.shared_alloc_.alloc = (Alloc *)0x0;
  new_ents2old_ents[3].write_.shared_alloc_.direct_ptr = (void *)0x0;
  new_ents2old_ents[2].write_.shared_alloc_.alloc = (Alloc *)0x0;
  new_ents2old_ents[2].write_.shared_alloc_.direct_ptr = (void *)0x0;
  new_ents2old_ents[1].write_.shared_alloc_.alloc = (Alloc *)0x0;
  new_ents2old_ents[1].write_.shared_alloc_.direct_ptr = (void *)0x0;
  new_ents2old_ents[0].write_.shared_alloc_.alloc = (Alloc *)0x0;
  new_ents2old_ents[0].write_.shared_alloc_.direct_ptr = (void *)0x0;
  lVar2 = 0;
  this = (Omega_h *)(auStack_98 + 0x10);
  while( true ) {
    IVar1 = Mesh::dim(mesh);
    if (IVar1 < lVar2) break;
    Mesh::globals((Mesh *)auStack_98,(Int)mesh);
    sort_by_keys<long>(this,(Read<long> *)auStack_98,1);
    Write<int>::operator=(this_00,(Write<int> *)this);
    Write<int>::~Write((Write<int> *)this);
    Write<long>::~Write((Write<long> *)auStack_98);
    lVar2 = lVar2 + 1;
    this_00 = this_00 + 1;
  }
  unmap_mesh(mesh,new_ents2old_ents);
  lVar2 = 0x30;
  do {
    Write<int>::~Write((Write<int> *)
                       ((long)&new_ents2old_ents[0].write_.shared_alloc_.alloc + lVar2));
    lVar2 = lVar2 + -0x10;
  } while (lVar2 != -0x10);
  return;
}

Assistant:

void reorder_by_globals(Mesh* mesh) {
  LOs new_ents2old_ents[4];
  for (Int ent_dim = 0; ent_dim <= mesh->dim(); ++ent_dim) {
    new_ents2old_ents[ent_dim] = sort_by_keys(mesh->globals(ent_dim));
  }
  unmap_mesh(mesh, new_ents2old_ents);
}